

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# security-bootstrapping.c
# Opt level: O2

int sec_boot_send_cert_interest(void)

{
  uint uVar1;
  ulong uVar2;
  undefined1 local_5a0 [8];
  ndn_interest_t cert_interest;
  ndn_encoder_t encoder;
  
  uVar2 = 0;
  while( true ) {
    if ((m_sec_boot_state.device_info)->service_list_size <= uVar2) {
      return 0;
    }
    _prepare_sec_boot_send_cert_interest
              ((ndn_interest_t *)local_5a0,(m_sec_boot_state.device_info)->service_list[uVar2]);
    memset(sec_boot_buf,0,0x1000);
    cert_interest.signature._648_8_ = sec_boot_buf;
    ndn_interest_tlv_encode
              ((ndn_encoder_t *)(cert_interest.signature.validity_period.not_after + 9),
               (ndn_interest_t *)local_5a0);
    printf("DEBUG: %s, L%d: ","sec_boot_send_cert_interest",0x11b);
    printf("[BOOTSTRAPPING] Sending the No.%d Cert Interest\n",(ulong)((int)uVar2 + 1));
    uVar1 = ndn_forwarder_express_interest
                      ((uint8_t *)cert_interest.signature._648_8_,0,on_cert_data,
                       on_sec_boot_cert_interest_timeout,
                       (m_sec_boot_state.device_info)->service_list + uVar2);
    if (uVar1 != 0) break;
    printf("DEBUG: %s, L%d: ","sec_boot_send_cert_interest",0x123);
    printf("[BOOTSTRAPPING] BOOTSTRAPPING-INT2-PKT-SIZE: %u Bytes\n",0);
    printf("INFO: %s: ","sec_boot_send_cert_interest");
    printf("[BOOTSTRAPPING] Send SEC BOOT cert Interest packet with name: ");
    putchar(10);
    ndn_name_print((ndn_name_t *)local_5a0);
    uVar2 = uVar2 + 1;
  }
  printf("ERROR: %s, L%d: ","sec_boot_send_cert_interest",0x120);
  printf("[BOOTSTRAPPING] Fail to send out adv Interest. Error Code: %d\n",(ulong)uVar1);
  return uVar1;
}

Assistant:

int
sec_boot_send_cert_interest()
{
  ndn_interest_t cert_interest;
  for (int i = 0; i < m_sec_boot_state.device_info->service_list_size; i++) {
    _prepare_sec_boot_send_cert_interest(&cert_interest,
                                         m_sec_boot_state.device_info->service_list[i]);
    ndn_encoder_t encoder;
    encoder_init(&encoder, sec_boot_buf, sizeof(sec_boot_buf));
    ndn_interest_tlv_encode(&encoder, &cert_interest);
    NDN_LOG_DEBUG("[BOOTSTRAPPING] Sending the No.%d Cert Interest\n", i + 1);
    int ret = ndn_forwarder_express_interest(encoder.output_value, encoder.offset,
                                             on_cert_data, on_sec_boot_cert_interest_timeout,
                                             &m_sec_boot_state.device_info->service_list[i]);
    if (ret != 0) {
      NDN_LOG_ERROR("[BOOTSTRAPPING] Fail to send out adv Interest. Error Code: %d\n", ret);
      return ret;
    }
    NDN_LOG_DEBUG("[BOOTSTRAPPING] BOOTSTRAPPING-INT2-PKT-SIZE: %u Bytes\n", encoder.offset);
    NDN_LOG_INFO("[BOOTSTRAPPING] Send SEC BOOT cert Interest packet with name: ");
    NDN_LOG_INFO_NAME(&cert_interest.name);

  }

  return NDN_SUCCESS;
}